

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O3

int Ronan::mystrnicmp1(char *a,char *b)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  
  bVar3 = *a;
  iVar1 = 0;
  if (bVar3 != 0) {
    lVar2 = 0;
    do {
      if (b[lVar2] == 0) {
        return 0;
      }
      if (((b[lVar2] ^ bVar3) & 0xdf) != 0) {
        return 0;
      }
      bVar3 = a[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (bVar3 != 0);
    iVar1 = (int)lVar2;
  }
  return iVar1;
}

Assistant:

int mystrnicmp1(const char *a, const char *b)
{
    int l = 0;
    while (*a && *b)
        if ((*a++ | 0x20) != (*b++ | 0x20))
            return 0;
        else
            l++;
    return *a ? 0 : l;
}